

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O3

AttributeContainer * __thiscall
stackjit::AssemblyImageLoader::loadAttributes_abi_cxx11_
          (AttributeContainer *__return_storage_ptr__,AssemblyImageLoader *this,BinaryData *data,
          size_t *index)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var3;
  string *psVar4;
  unsigned_long uVar5;
  string value;
  string key;
  Attribute attribute;
  string local_e8;
  string local_c8;
  string local_a8;
  Attribute local_88;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  uVar1 = anon_unknown_4::loadData<unsigned_long>
                    (*(anon_unknown_4 **)this,*(BinaryData **)(this + 8),(size_t *)data);
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      (anonymous_namespace)::loadString_abi_cxx11_
                (&local_a8,(_anonymous_namespace_ *)this,data,index);
      Loader::Attribute::Attribute(&local_88,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      uVar2 = anon_unknown_4::loadData<unsigned_long>
                        (*(anon_unknown_4 **)this,*(BinaryData **)(this + 8),(size_t *)data);
      for (; uVar2 != 0; uVar2 = uVar2 - 1) {
        (anonymous_namespace)::loadString_abi_cxx11_
                  (&local_c8,(_anonymous_namespace_ *)this,data,index);
        (anonymous_namespace)::loadString_abi_cxx11_
                  (&local_e8,(_anonymous_namespace_ *)this,data,index);
        p_Var3 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)Loader::Attribute::values_abi_cxx11_(&local_88);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>(p_Var3,&local_c8,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      psVar4 = Loader::Attribute::name_abi_cxx11_(&local_88);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string_const&,stackjit::Loader::Attribute&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)__return_storage_ptr__,psVar4,&local_88);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_88.mValues._M_h);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.mName._M_dataplus._M_p != &local_88.mName.field_2) {
        operator_delete(local_88.mName._M_dataplus._M_p);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Loader::AttributeContainer AssemblyImageLoader::loadAttributes(BinaryData& data, std::size_t& index) {
		Loader::AttributeContainer attributes;
		std::size_t numAttributes = loadData<std::size_t>(data, index);
		for (std::size_t i = 0; i < numAttributes; i++) {
			Loader::Attribute attribute(loadString(data, index));

			std::size_t numValues = loadData<std::size_t>(data, index);
			for (std::size_t j = 0; j < numValues; j++) {
				std::string key = loadString(data, index);
				std::string value = loadString(data, index);
				attribute.values().emplace(key, value);
			}

			attributes.emplace(attribute.name(), attribute);
		}

		return attributes;
	}